

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,string *base_expr
          ,SPIRType *type)

{
  SmallVector<unsigned_int,_8UL> *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  char cVar19;
  char cVar20;
  bool bVar21;
  uint32_t uVar22;
  SPIRType *pSVar23;
  uint uVar24;
  ulong uVar25;
  SmallVector<unsigned_int,_8UL> *pSVar26;
  uint __val;
  bool bVar27;
  string *expr;
  string __str;
  string subexpr;
  SPIRType tmp_type;
  string local_210;
  SPIRType *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  SPIRType *local_1e0;
  string *local_1d8;
  string local_1d0;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 local_190 [208];
  SmallVector<unsigned_int,_8UL> local_c0;
  ImageType local_88;
  TypeID TStack_70;
  TypeID TStack_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  bVar27 = false;
  if (type->basetype == Boolean && parent_type->basetype == Struct) {
    bVar27 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  local_190._8_4_ = 0;
  local_190._0_8_ = &PTR__SPIRType_0049ded8;
  local_190._12_8_ = 0;
  local_190._20_4_ = 0;
  local_190._24_4_ = 1;
  local_190._28_4_ = 1;
  this_00 = (SmallVector<unsigned_int,_8UL> *)(local_190 + 0x20);
  local_190._32_8_ = local_190 + 0x38;
  local_190._40_8_ = 0;
  local_190._48_8_ = 8;
  local_190._88_8_ = local_190 + 0x70;
  local_190._96_8_ = 0;
  local_190._104_8_ = 8;
  local_190._120_8_ = local_190._120_8_ & 0xffff000000000000;
  local_190._128_4_ = 0;
  local_190._132_4_ = 0;
  local_190._136_4_ = 0;
  local_190._140_4_ = 0;
  local_190._144_4_ = Generic;
  local_190._152_8_ = local_190 + 0xb0;
  local_190._160_8_ = 0;
  local_190._168_8_ = 8;
  local_c0.super_VectorView<unsigned_int>.ptr = (uint *)&local_c0.stack_storage;
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  local_c0.buffer_capacity = 8;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_88._0_7_ = 0;
  local_88._7_4_ = 0;
  TStack_6c.id = 0;
  local_88.sampled = 0;
  local_88.format = ImageFormatUnknown;
  local_88.access = AccessQualifierReadOnly;
  TStack_70.id = 0;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pSVar26 = this_00;
  local_1e0 = parent_type;
  local_1d8 = base_expr;
  if (bVar27) {
    pSVar23 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (type->parent_type).id);
    local_190._8_4_ = (pSVar23->super_IVariant).self.id;
    local_190._28_4_ = pSVar23->columns;
    local_190._12_8_ = *(undefined8 *)&(pSVar23->super_IVariant).field_0xc;
    local_190._20_4_ = pSVar23->width;
    local_190._24_4_ = pSVar23->vecsize;
    SmallVector<unsigned_int,_8UL>::operator=(this_00,&pSVar23->array);
    SmallVector<bool,_8UL>::operator=
              ((SmallVector<bool,_8UL> *)(local_190 + 0x58),&pSVar23->array_size_literal);
    local_190._120_4_ = pSVar23->pointer_depth;
    local_190[0x7c] = pSVar23->pointer;
    local_190[0x7d] = pSVar23->forward_pointer;
    local_190._126_2_ = *(undefined2 *)&pSVar23->field_0x7e;
    uVar1 = (pSVar23->cooperative).use_id;
    uVar2 = (pSVar23->cooperative).rows_id;
    uVar3 = (pSVar23->cooperative).columns_id;
    uVar4 = *(undefined8 *)&(pSVar23->cooperative).scope_id;
    local_190._140_4_ = (undefined4)uVar4;
    local_190._144_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    local_190._128_4_ = uVar1;
    local_190._132_4_ = uVar2;
    local_190._136_4_ = uVar3;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_190 + 0x98),
               &pSVar23->member_types);
    SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar23->member_type_index_redirection);
    uVar5._0_4_ = (pSVar23->image).type;
    uVar5._4_4_ = (pSVar23->image).dim;
    uVar6._0_1_ = (pSVar23->image).depth;
    uVar6._1_1_ = (pSVar23->image).arrayed;
    uVar6._2_1_ = (pSVar23->image).ms;
    uVar6._3_1_ = (pSVar23->image).field_0xb;
    uVar6._4_4_ = (pSVar23->image).sampled;
    uVar7 = (pSVar23->image).format;
    uVar8 = (pSVar23->image).access;
    uVar9 = pSVar23->type_alias;
    uVar10 = pSVar23->parent_type;
    local_88._0_7_ = SUB87(uVar5,0);
    local_88.dim._3_1_ = (undefined1)((uint)uVar5._4_4_ >> 0x18);
    local_88._8_3_ = SUB83(uVar6,0);
    local_88._11_1_ = uVar6._3_1_;
    local_88.sampled = uVar6._4_4_;
    local_88.format = uVar7;
    local_88.access = uVar8;
    TStack_70.id = uVar9;
    TStack_6c.id = uVar10;
    if (pSVar23 != (SPIRType *)local_190) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&(pSVar23->member_name_cache)._M_h);
    }
    local_190._16_4_ = (this->backend).boolean_in_struct_remapped_type;
  }
  else if ((type->basetype == Boolean) &&
          ((this->backend).boolean_in_struct_remapped_type != Boolean)) {
    pSVar23 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (type->parent_type).id);
    local_190._8_4_ = (pSVar23->super_IVariant).self.id;
    local_190._28_4_ = pSVar23->columns;
    local_190._12_8_ = *(undefined8 *)&(pSVar23->super_IVariant).field_0xc;
    local_190._20_4_ = pSVar23->width;
    local_190._24_4_ = pSVar23->vecsize;
    SmallVector<unsigned_int,_8UL>::operator=(this_00,&pSVar23->array);
    SmallVector<bool,_8UL>::operator=
              ((SmallVector<bool,_8UL> *)(local_190 + 0x58),&pSVar23->array_size_literal);
    local_190._120_4_ = pSVar23->pointer_depth;
    local_190[0x7c] = pSVar23->pointer;
    local_190[0x7d] = pSVar23->forward_pointer;
    local_190._126_2_ = *(undefined2 *)&pSVar23->field_0x7e;
    uVar11 = (pSVar23->cooperative).use_id;
    uVar12 = (pSVar23->cooperative).rows_id;
    uVar13 = (pSVar23->cooperative).columns_id;
    uVar4 = *(undefined8 *)&(pSVar23->cooperative).scope_id;
    local_190._140_4_ = (undefined4)uVar4;
    local_190._144_4_ = (undefined4)((ulong)uVar4 >> 0x20);
    local_190._128_4_ = uVar11;
    local_190._132_4_ = uVar12;
    local_190._136_4_ = uVar13;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)(local_190 + 0x98),
               &pSVar23->member_types);
    SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&pSVar23->member_type_index_redirection);
    uVar4._0_4_ = (pSVar23->image).type;
    uVar4._4_4_ = (pSVar23->image).dim;
    uVar14._0_1_ = (pSVar23->image).depth;
    uVar14._1_1_ = (pSVar23->image).arrayed;
    uVar14._2_1_ = (pSVar23->image).ms;
    uVar14._3_1_ = (pSVar23->image).field_0xb;
    uVar14._4_4_ = (pSVar23->image).sampled;
    uVar15 = (pSVar23->image).format;
    uVar16 = (pSVar23->image).access;
    uVar17 = pSVar23->type_alias;
    uVar18 = pSVar23->parent_type;
    local_88._0_7_ = SUB87(uVar4,0);
    local_88.dim._3_1_ = (undefined1)((uint)uVar4._4_4_ >> 0x18);
    local_88._8_3_ = SUB83(uVar14,0);
    bVar27 = true;
    local_88._11_1_ = uVar14._3_1_;
    local_88.sampled = uVar14._4_4_;
    local_88.format = uVar15;
    local_88.access = uVar16;
    TStack_70.id = uVar17;
    TStack_6c.id = uVar18;
    if (pSVar23 != (SPIRType *)local_190) {
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_68,&(pSVar23->member_name_cache)._M_h);
    }
  }
  uVar22 = to_array_size_literal
                     (this,type,(int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1);
  local_1f0 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (type->parent_type).id);
  local_1e8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1e8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{ ","");
  if (uVar22 != 0) {
    __val = 0;
    do {
      cVar20 = '\x01';
      if (9 < __val) {
        uVar25 = (ulong)__val;
        cVar19 = '\x04';
        do {
          cVar20 = cVar19;
          uVar24 = (uint)uVar25;
          if (uVar24 < 100) {
            cVar20 = cVar20 + -2;
            goto LAB_002d8dba;
          }
          if (uVar24 < 1000) {
            cVar20 = cVar20 + -1;
            goto LAB_002d8dba;
          }
          if (uVar24 < 10000) goto LAB_002d8dba;
          uVar25 = uVar25 / 10000;
          cVar19 = cVar20 + '\x04';
        } while (99999 < uVar24);
        cVar20 = cVar20 + '\x01';
      }
LAB_002d8dba:
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_210,cVar20);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_210._M_dataplus._M_p,(uint)local_210._M_string_length,__val);
      join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_1d0,(spirv_cross *)local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x391742,
                 (char (*) [2])&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x391647,
                 (char (*) [2])pSVar26);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      bVar21 = Compiler::is_array(&this->super_Compiler,local_1f0);
      if (bVar21) {
        to_rerolled_array_expression(&local_210,this,local_1e0,&local_1d0,local_1f0);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_210._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p);
        }
      }
      else {
        if (bVar27) {
          (*(this->super_Compiler)._vptr_Compiler[0x13])((spirv_cross *)local_1b0,this,local_190,0);
          join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                    (&local_210,(spirv_cross *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a67d9,
                     (char (*) [2])&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3b224b,
                     (char (*) [2])pSVar26);
          ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
          }
          if (local_1b0[0] != local_1a0) {
            operator_delete(local_1b0[0]);
          }
        }
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
      }
      __val = __val + 1;
      if (__val < uVar22) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
    } while (__val != uVar22);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_190._0_8_ = &PTR__SPIRType_0049ded8;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_c0.super_VectorView<unsigned_int>.ptr !=
      &local_c0.stack_storage) {
    free(local_c0.super_VectorView<unsigned_int>.ptr);
  }
  local_190._160_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_190._152_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_190 + 0xb0)) {
    free((void *)local_190._152_8_);
  }
  local_190._96_8_ = 0;
  if ((undefined1 *)local_190._88_8_ != local_190 + 0x70) {
    free((void *)local_190._88_8_);
  }
  local_190._40_8_ = 0;
  if ((undefined1 *)local_190._32_8_ != local_190 + 0x38) {
    free((void *)local_190._32_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const SPIRType &parent_type,
                                                  const string &base_expr, const SPIRType &type)
{
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	SPIRType tmp_type { OpNop };
	if (remapped_boolean)
	{
		tmp_type = get<SPIRType>(type.parent_type);
		tmp_type.basetype = backend.boolean_in_struct_remapped_type;
	}
	else if (type.basetype == SPIRType::Boolean && backend.boolean_in_struct_remapped_type != SPIRType::Boolean)
	{
		// It's possible that we have an r-value expression that was OpLoaded from a struct.
		// We have to reroll this and explicitly cast the input to bool, because the r-value is short.
		tmp_type = get<SPIRType>(type.parent_type);
		remapped_boolean = true;
	}

	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (!is_array(parent))
		{
			if (remapped_boolean)
				subexpr = join(type_to_glsl(tmp_type), "(", subexpr, ")");
			expr += subexpr;
		}
		else
			expr += to_rerolled_array_expression(parent_type, subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}